

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjLookupTable::discard_undo(CVmObjLookupTable *this,CVmUndoRecord *rec)

{
  if ((rec->id).ptrval != (void *)0x0) {
    free((rec->id).ptrval);
    (rec->id).ptrval = (void *)0x0;
  }
  return;
}

Assistant:

void CVmObjLookupTable::discard_undo(VMG_ CVmUndoRecord *rec)
{
    /* delete our extra information record */
    if (rec->id.ptrval != 0)
    {
        /* free the record */
        t3free((lookuptab_undo_rec *)rec->id.ptrval);

        /* clear the pointer so we know it's gone */
        rec->id.ptrval = 0;
    }
}